

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSObjectFactory::processFacets
          (XSObjectFactory *this,DatatypeValidator *dv,XSModel *xsModel,XSSimpleTypeDefinition *xsST
          )

{
  bool bVar1;
  short theType;
  uint uVar2;
  uint uVar3;
  int iVar4;
  TYPE_CATEGORY TVar5;
  FACET FVar6;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *this_00;
  undefined4 extraout_var;
  XSMultiValueFacet *pXVar7;
  XSAnnotation *headAnnot;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *pRVar8;
  KVStringPair *this_01;
  XSFacet *pXVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XSSimpleTypeDefinition *this_02;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *this_03;
  XMLSize_t XVar11;
  XSMultiValueFacetList *pXVar12;
  BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *this_04;
  XSMultiValueFacet *bFacet_1;
  uint j;
  XSMultiValueFacetList *baseMVFacets;
  XSFacet *bFacet;
  uint i;
  XSFacetList *baseFacets;
  XSSimpleTypeDefinition *baseST;
  XSFacet *xsFacet_1;
  XSFacet *xsFacet;
  XSMultiValueFacet *mvFacet_1;
  XMLStringTokenizer tokenizer;
  XSAnnotation *annot;
  FACET facetType;
  XMLCh *key;
  KVStringPair *pair;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  XSMultiValueFacet *mvFacet;
  RefArrayVectorOf<char16_t> *enumList;
  XSFacetList *xsFacetList;
  StringList *patternList;
  XSMultiValueFacetList *xsMultiFacetList;
  FACET local_38;
  int fixedFacets;
  int definedFacets;
  int dvFixedFacets;
  int dvFacetsDefined;
  bool isFixed;
  XSSimpleTypeDefinition *xsST_local;
  XSModel *xsModel_local;
  DatatypeValidator *dv_local;
  XSObjectFactory *this_local;
  undefined4 extraout_var_02;
  
  dvFixedFacets._3_1_ = false;
  uVar2 = DatatypeValidator::getFacetsDefined(dv);
  uVar3 = DatatypeValidator::getFixed(dv);
  local_38 = FACET_NONE;
  xsMultiFacetList._4_4_ = FACET_NONE;
  patternList = (StringList *)0x0;
  xsFacetList = (XSFacetList *)0x0;
  this_00 = (BaseRefVectorOf<xercesc_4_0::XSFacet> *)
            XMemory::operator_new(0x30,this->fMemoryManager);
  RefVectorOf<xercesc_4_0::XSFacet>::RefVectorOf
            ((RefVectorOf<xercesc_4_0::XSFacet> *)this_00,4,false,this->fMemoryManager);
  bVar1 = isMultiValueFacetDefined(this,dv);
  if (bVar1) {
    patternList = (StringList *)XMemory::operator_new(0x30,this->fMemoryManager);
    RefVectorOf<xercesc_4_0::XSMultiValueFacet>::RefVectorOf
              ((RefVectorOf<xercesc_4_0::XSMultiValueFacet> *)patternList,2,false,
               this->fMemoryManager);
  }
  if ((uVar2 & 0x10) != 0) {
    iVar4 = (*(dv->super_XSerializable)._vptr_XSerializable[6])();
    dvFixedFacets._3_1_ = (uVar3 & 0x10) != 0;
    if (dvFixedFacets._3_1_) {
      xsMultiFacetList._4_4_ = FACET_ENUMERATION;
    }
    pXVar7 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    headAnnot = getAnnotationFromModel(this,xsModel,(StringList *)CONCAT44(extraout_var,iVar4));
    XSMultiValueFacet::XSMultiValueFacet
              (pXVar7,FACET_ENUMERATION,(StringList *)CONCAT44(extraout_var,iVar4),
               dvFixedFacets._3_1_,headAnnot,xsModel,this->fMemoryManager);
    e.fMemoryManager = (MemoryManager *)pXVar7;
    BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
              (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)pXVar7
              );
    BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::addElement
              ((BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)patternList,
               (XSMultiValueFacet *)e.fMemoryManager);
    local_38 = FACET_ENUMERATION;
  }
  pRVar8 = DatatypeValidator::getFacets(dv);
  if (pRVar8 != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    pRVar8 = DatatypeValidator::getFacets(dv);
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               &pair,pRVar8,false,this->fMemoryManager);
    while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
                   hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                                    *)&pair), bVar1) {
      this_01 = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
                nextElement((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                             *)&pair);
      pXVar10 = KVStringPair::getKey(this_01);
      tokenizer.fMemoryManager = (MemoryManager *)getAnnotationFromModel(this,xsModel,this_01);
      bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE);
      if (bVar1) {
        annot._4_4_ = FACET_MAXINCLUSIVE;
        uVar2 = uVar3 & 0x20;
LAB_00390552:
        dvFixedFacets._3_1_ = uVar2 != 0;
        pXVar9 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
        pXVar10 = KVStringPair::getValue(this_01);
        XSFacet::XSFacet(pXVar9,annot._4_4_,pXVar10,dvFixedFacets._3_1_,
                         (XSAnnotation *)tokenizer.fMemoryManager,xsModel,this->fMemoryManager);
        BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
                  (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,
                   (XSObject *)pXVar9);
        BaseRefVectorOf<xercesc_4_0::XSFacet>::addElement(this_00,pXVar9);
        local_38 = annot._4_4_ | local_38;
        if (dvFixedFacets._3_1_) {
          xsMultiFacetList._4_4_ = annot._4_4_ | xsMultiFacetList._4_4_;
        }
      }
      else {
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_MAXEXCLUSIVE);
        if (bVar1) {
          annot._4_4_ = FACET_MAXEXCLUSIVE;
          uVar2 = uVar3 & 0x40;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE);
        if (bVar1) {
          annot._4_4_ = FACET_MININCLUSIVE;
          uVar2 = uVar3 & 0x80;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_MINEXCLUSIVE);
        if (bVar1) {
          annot._4_4_ = FACET_MINEXCLUSIVE;
          uVar2 = uVar3 & 0x100;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_LENGTH);
        if (bVar1) {
          annot._4_4_ = FACET_LENGTH;
          uVar2 = uVar3 & 1;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_MINLENGTH);
        if (bVar1) {
          annot._4_4_ = FACET_MINLENGTH;
          uVar2 = uVar3 & 2;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_MAXLENGTH);
        if (bVar1) {
          annot._4_4_ = FACET_MAXLENGTH;
          uVar2 = uVar3 & 4;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_TOTALDIGITS);
        if (bVar1) {
          annot._4_4_ = FACET_TOTALDIGITS;
          uVar2 = uVar3 & 0x200;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_FRACTIONDIGITS);
        if (bVar1) {
          annot._4_4_ = FACET_FRACTIONDIGITS;
          uVar2 = uVar3 & 0x400;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_WHITESPACE);
        if (bVar1) {
          annot._4_4_ = FACET_WHITESPACE;
          uVar2 = uVar3 & 0x4000;
          goto LAB_00390552;
        }
        bVar1 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
        if ((bVar1) && (patternList != (StringList *)0x0)) {
          pXVar10 = DatatypeValidator::getPattern(dv);
          XMLStringTokenizer::XMLStringTokenizer
                    ((XMLStringTokenizer *)&mvFacet_1,pXVar10,(XMLCh *)&regexSeparator,
                     this->fMemoryManager);
          xsFacetList = (XSFacetList *)XMemory::operator_new(0x30,this->fMemoryManager);
          uVar2 = XMLStringTokenizer::countTokens((XMLStringTokenizer *)&mvFacet_1);
          RefArrayVectorOf<char16_t>::RefArrayVectorOf
                    ((RefArrayVectorOf<char16_t> *)xsFacetList,(ulong)uVar2,true,
                     this->fMemoryManager);
          while (bVar1 = XMLStringTokenizer::hasMoreTokens((XMLStringTokenizer *)&mvFacet_1), bVar1)
          {
            pXVar10 = XMLStringTokenizer::nextToken((XMLStringTokenizer *)&mvFacet_1);
            pXVar10 = XMLString::replicate(pXVar10,this->fMemoryManager);
            BaseRefVectorOf<char16_t>::addElement((BaseRefVectorOf<char16_t> *)xsFacetList,pXVar10);
          }
          if ((uVar3 & 8) != 0) {
            dvFixedFacets._3_1_ = true;
            xsMultiFacetList._4_4_ = xsMultiFacetList._4_4_ | FACET_PATTERN;
          }
          pXVar7 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
          XSMultiValueFacet::XSMultiValueFacet
                    (pXVar7,FACET_PATTERN,(StringList *)xsFacetList,dvFixedFacets._3_1_,
                     (XSAnnotation *)tokenizer.fMemoryManager,xsModel,this->fMemoryManager);
          BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
                    (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,
                     (XSObject *)pXVar7);
          BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::addElement
                    ((BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)patternList,pXVar7);
          local_38 = local_38 | FACET_PATTERN;
          XMLStringTokenizer::~XMLStringTokenizer((XMLStringTokenizer *)&mvFacet_1);
        }
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               &pair);
  }
  if ((local_38 & FACET_WHITESPACE) == FACET_NONE) {
    pXVar9 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    theType = DatatypeValidator::getWSFacet(dv);
    pXVar10 = DatatypeValidator::getWSstring(dv,theType);
    XSFacet::XSFacet(pXVar9,FACET_WHITESPACE,pXVar10,false,(XSAnnotation *)0x0,xsModel,
                     this->fMemoryManager);
    BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
              (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)pXVar9
              );
    BaseRefVectorOf<xercesc_4_0::XSFacet>::addElement(this_00,pXVar9);
    local_38 = local_38 | FACET_WHITESPACE;
  }
  iVar4 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])();
  if (CONCAT44(extraout_var_00,iVar4) != 0) {
    iVar4 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])();
    TVar5 = XSTypeDefinition::getTypeCategory((XSTypeDefinition *)CONCAT44(extraout_var_01,iVar4));
    if (TVar5 == SIMPLE_TYPE) {
      iVar4 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])();
      this_02 = (XSSimpleTypeDefinition *)CONCAT44(extraout_var_02,iVar4);
      this_03 = &XSSimpleTypeDefinition::getFacets(this_02)->
                 super_BaseRefVectorOf<xercesc_4_0::XSFacet>;
      for (bFacet._4_4_ = 0; XVar11 = BaseRefVectorOf<xercesc_4_0::XSFacet>::size(this_03),
          bFacet._4_4_ < XVar11; bFacet._4_4_ = bFacet._4_4_ + 1) {
        pXVar9 = BaseRefVectorOf<xercesc_4_0::XSFacet>::elementAt(this_03,(ulong)bFacet._4_4_);
        FVar6 = XSFacet::getFacetKind(pXVar9);
        if ((local_38 & FVar6) == FACET_NONE) {
          FVar6 = XSFacet::getFacetKind(pXVar9);
          local_38 = FVar6 | local_38;
          BaseRefVectorOf<xercesc_4_0::XSFacet>::addElement(this_00,pXVar9);
          bVar1 = XSFacet::isFixed(pXVar9);
          if (bVar1) {
            FVar6 = XSFacet::getFacetKind(pXVar9);
            xsMultiFacetList._4_4_ = FVar6 | xsMultiFacetList._4_4_;
          }
        }
      }
      pXVar12 = XSSimpleTypeDefinition::getMultiValueFacets(this_02);
      if ((pXVar12 != (XSMultiValueFacetList *)0x0) && (patternList != (StringList *)0x0)) {
        this_04 = &XSSimpleTypeDefinition::getMultiValueFacets(this_02)->
                   super_BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>;
        for (bFacet_1._4_4_ = 0;
            XVar11 = BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::size(this_04),
            bFacet_1._4_4_ < XVar11; bFacet_1._4_4_ = bFacet_1._4_4_ + 1) {
          pXVar7 = BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::elementAt
                             (this_04,(ulong)bFacet_1._4_4_);
          FVar6 = XSMultiValueFacet::getFacetKind(pXVar7);
          if ((local_38 & FVar6) == FACET_NONE) {
            FVar6 = XSMultiValueFacet::getFacetKind(pXVar7);
            local_38 = FVar6 | local_38;
            BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::addElement
                      ((BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)patternList,pXVar7);
            bVar1 = XSMultiValueFacet::isFixed(pXVar7);
            if (bVar1) {
              FVar6 = XSMultiValueFacet::getFacetKind(pXVar7);
              xsMultiFacetList._4_4_ = FVar6 | xsMultiFacetList._4_4_;
            }
          }
        }
      }
    }
  }
  XSSimpleTypeDefinition::setFacetInfo
            (xsST,local_38,xsMultiFacetList._4_4_,(XSFacetList *)this_00,
             (XSMultiValueFacetList *)patternList,(StringList *)xsFacetList);
  return;
}

Assistant:

void XSObjectFactory::processFacets(DatatypeValidator* const dv,
                                    XSModel* const xsModel,
                                    XSSimpleTypeDefinition* const xsST)
{
    // NOTE: XSMultiValueFacetList is not owned by XSModel!
    // NOTE: XSFacetList is not owned by XSModel!
    bool isFixed = false;
    int dvFacetsDefined = dv->getFacetsDefined();
    int dvFixedFacets = dv->getFixed();
    int definedFacets = 0;
    int fixedFacets = 0;
    XSMultiValueFacetList* xsMultiFacetList = 0;
    StringList* patternList = 0;
    XSFacetList* xsFacetList = new (fMemoryManager) RefVectorOf<XSFacet>(4, false, fMemoryManager);

    if (isMultiValueFacetDefined(dv))
        xsMultiFacetList = new (fMemoryManager) RefVectorOf<XSMultiValueFacet>(2, false, fMemoryManager);

    if (dvFacetsDefined & DatatypeValidator::FACET_ENUMERATION)
    {
        RefArrayVectorOf<XMLCh>* enumList = (RefArrayVectorOf<XMLCh>*) dv->getEnumString();

        if (dvFixedFacets & DatatypeValidator::FACET_ENUMERATION)
        {
            isFixed = true;
            fixedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
        }

        XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
            XSSimpleTypeDefinition::FACET_ENUMERATION , enumList, isFixed
            , getAnnotationFromModel(xsModel, enumList), xsModel, fMemoryManager
        );

        fDeleteVector->addElement(mvFacet);
        xsMultiFacetList->addElement(mvFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
    }

    if (dv->getFacets())
    {
        RefHashTableOfEnumerator<KVStringPair> e(dv->getFacets(), false, fMemoryManager);
        while (e.hasMoreElements())
        {
            KVStringPair& pair = e.nextElement();
            XMLCh* key = pair.getKey();
            XSSimpleTypeDefinition::FACET facetType;
            XSAnnotation* annot = getAnnotationFromModel(xsModel, &pair);

            if (XMLString::equals(key, SchemaSymbols::fgELT_MAXINCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXINCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXINCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXEXCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MININCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MININCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MININCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINEXCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_LENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_LENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_LENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_TOTALDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_TOTALDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_TOTALDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_FRACTIONDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_FRACTIONDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_WHITESPACE))
            {
                facetType = XSSimpleTypeDefinition::FACET_WHITESPACE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_WHITESPACE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN) && xsMultiFacetList)
            {
                XMLStringTokenizer tokenizer(dv->getPattern(), regexSeparator, fMemoryManager);
                patternList = new (fMemoryManager) RefArrayVectorOf<XMLCh>(
                    tokenizer.countTokens(), true, fMemoryManager
                );

                while (tokenizer.hasMoreTokens())
                    patternList->addElement(XMLString::replicate(tokenizer.nextToken(), fMemoryManager));

                if (dvFixedFacets & DatatypeValidator::FACET_PATTERN)
                {
                    isFixed = true;
                    fixedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                }

                XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
                    XSSimpleTypeDefinition::FACET_PATTERN, patternList
                    , isFixed, annot, xsModel, fMemoryManager
                );
                fDeleteVector->addElement(mvFacet);
                xsMultiFacetList->addElement(mvFacet);
                definedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                continue;
            }
            else
            {
                // REVISIT: hmm... what about XSSimpleTypeDefinition::FACET_NONE
                // don't think I need to create an empty Facet?
                continue;
            }

            XSFacet* xsFacet = new (fMemoryManager) XSFacet(
                facetType, pair.getValue(), isFixed, annot, xsModel, fMemoryManager);

            fDeleteVector->addElement(xsFacet);
            xsFacetList->addElement(xsFacet);
            definedFacets |= facetType;
            if (isFixed)
                fixedFacets |= facetType;
        }
    }

    // add whistespace facet if missing
    if ((definedFacets & XSSimpleTypeDefinition::FACET_WHITESPACE) == 0)
    {
        XSFacet* xsFacet = new (fMemoryManager) XSFacet(
            XSSimpleTypeDefinition::FACET_WHITESPACE
            , dv->getWSstring(dv->getWSFacet())
            , false, 0, xsModel, fMemoryManager);

        fDeleteVector->addElement(xsFacet);
        xsFacetList->addElement(xsFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_WHITESPACE;
    }

    // inherit facets from base

    if (xsST->getBaseType() && xsST->getBaseType()->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE)
    {
        XSSimpleTypeDefinition* baseST = (XSSimpleTypeDefinition*) xsST->getBaseType();
        XSFacetList* baseFacets = baseST->getFacets();

        for (unsigned int i=0; i<baseFacets->size(); i++)
        {
            XSFacet* bFacet = baseFacets->elementAt(i);
            if ((definedFacets & bFacet->getFacetKind()) == 0)
            {
                definedFacets |= bFacet->getFacetKind();
                xsFacetList->addElement(bFacet);
                if (bFacet->isFixed())
                    fixedFacets |= bFacet->getFacetKind();
            }
        }

        if (baseST->getMultiValueFacets() && xsMultiFacetList)
        {
            XSMultiValueFacetList* baseMVFacets = baseST->getMultiValueFacets();
            for (unsigned int j=0; j<baseMVFacets->size(); j++)
            {
                XSMultiValueFacet* bFacet = baseMVFacets->elementAt(j);
                if ((definedFacets & bFacet->getFacetKind()) == 0)
                {
                    definedFacets |= bFacet->getFacetKind();
                    xsMultiFacetList->addElement(bFacet);
                    if (bFacet->isFixed())
                        fixedFacets |= bFacet->getFacetKind();
                }
            }
        }
    }

    xsST->setFacetInfo(definedFacets, fixedFacets, xsFacetList, xsMultiFacetList, patternList);
}